

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

uint8_t av1_findSamples(AV1_COMMON *cm,MACROBLOCKD *xd,int *pts,int *pts_inref)

{
  char cVar1;
  _Bool _Var2;
  _Bool _Var3;
  BLOCK_SIZE BVar4;
  uint uVar5;
  int mi_row;
  MB_MODE_INFO **ppMVar6;
  MB_MODE_INFO *pMVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  byte bVar18;
  int *local_50;
  uint uVar19;
  
  ppMVar6 = xd->mi;
  cVar1 = (*ppMVar6)->ref_frame[0];
  _Var2 = xd->up_available;
  _Var3 = xd->left_available;
  uVar5 = xd->mi_stride;
  mi_row = xd->mi_row;
  iVar13 = xd->mi_col;
  bVar9 = true;
  local_50 = pts;
  if (_Var2 == true) {
    pMVar7 = ppMVar6[-(long)(int)uVar5];
    BVar4 = pMVar7->bsize;
    bVar15 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar4];
    bVar11 = xd->width;
    if (bVar15 < bVar11) {
      iVar14 = (cm->mi_params).mi_cols;
      uVar16 = 0;
      if (iVar13 < iVar14) {
        uVar19 = 0;
        do {
          pMVar7 = ppMVar6[(int)(uVar16 - uVar5)];
          BVar4 = pMVar7->bsize;
          bVar15 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [BVar4];
          if ((pMVar7->ref_frame[0] == cVar1) && (pMVar7->ref_frame[1] == -1)) {
            bVar18 = block_size_wide[BVar4];
            bVar10 = block_size_high[BVar4];
            *local_50 = uVar16 * 0x20 + (bVar18 & 0xfe) * 4 + -8;
            local_50[1] = (~(uint)bVar10 & 0x3ffffffe) << 2;
            *pts_inref = (int)pMVar7->mv[0].as_mv.col + uVar16 * 0x20 + (bVar18 & 0xfe) * 4 + -8;
            pts_inref[1] = (int)pMVar7->mv[0].as_mv.row + local_50[1];
            bVar18 = (char)uVar19 + 1;
            uVar19 = (uint)bVar18;
            if (7 < bVar18) {
              return '\b';
            }
            pts_inref = pts_inref + 2;
            local_50 = local_50 + 2;
            iVar14 = (cm->mi_params).mi_cols;
          }
          uVar16 = uVar16 + bVar15;
          uVar12 = iVar14 - iVar13;
          if ((int)(uint)bVar11 <= (int)uVar12) {
            uVar12 = (uint)bVar11;
          }
        } while ((int)uVar16 < (int)uVar12);
        bVar8 = true;
        bVar9 = true;
        uVar16 = uVar19;
      }
      else {
        bVar8 = true;
      }
    }
    else {
      iVar14 = iVar13 % (int)(uint)bVar15;
      bVar8 = iVar14 < 1;
      bVar9 = (int)((uint)bVar15 - iVar14) <= (int)(uint)bVar11;
      if ((pMVar7->ref_frame[0] == cVar1) && (pMVar7->ref_frame[1] == -1)) {
        bVar15 = block_size_high[BVar4];
        iVar14 = (block_size_wide[BVar4] & 0xfe) * 4 + iVar14 * -0x20;
        *pts = iVar14 + -8;
        pts[1] = (~(uint)bVar15 & 0x3ffffffe) << 2;
        *pts_inref = pMVar7->mv[0].as_mv.col + iVar14 + -8;
        pts_inref[1] = (int)pMVar7->mv[0].as_mv.row + pts[1];
        local_50 = pts + 2;
        pts_inref = pts_inref + 2;
        uVar16 = 1;
      }
      else {
        uVar16 = 0;
      }
    }
  }
  else {
    bVar8 = true;
    uVar16 = 0;
  }
  bVar15 = (byte)uVar16;
  if (_Var3 != false) {
    pMVar7 = ppMVar6[-1];
    BVar4 = pMVar7->bsize;
    bVar11 = xd->height;
    if ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar4] < bVar11
       ) {
      iVar14 = (cm->mi_params).mi_rows;
      if (mi_row < iVar14) {
        iVar17 = 0;
        do {
          pMVar7 = ppMVar6[(long)(int)(iVar17 * uVar5) + -1];
          BVar4 = pMVar7->bsize;
          bVar18 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar4];
          if ((pMVar7->ref_frame[0] == cVar1) && (pMVar7->ref_frame[1] == -1)) {
            bVar15 = block_size_high[BVar4];
            iVar14 = (~(uint)block_size_wide[BVar4] & 0x3ffffffe) * 4;
            *local_50 = iVar14;
            local_50[1] = iVar17 * 0x20 + (bVar15 & 0xfe) * 4 + -8;
            *pts_inref = pMVar7->mv[0].as_mv.col + iVar14;
            pts_inref[1] = (int)pMVar7->mv[0].as_mv.row + local_50[1];
            bVar15 = (char)uVar16 + 1;
            uVar16 = (uint)bVar15;
            if (7 < bVar15) {
              return '\b';
            }
            pts_inref = pts_inref + 2;
            local_50 = local_50 + 2;
            iVar14 = (cm->mi_params).mi_rows;
          }
          bVar15 = (byte)uVar16;
          iVar17 = iVar17 + (uint)bVar18;
          uVar19 = iVar14 - mi_row;
          if ((int)(uint)bVar11 <= iVar14 - mi_row) {
            uVar19 = (uint)bVar11;
          }
        } while (iVar17 < (int)uVar19);
      }
    }
    else {
      iVar14 = mi_row % (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                   [BVar4];
      if (0 < iVar14) {
        bVar8 = false;
      }
      if ((pMVar7->ref_frame[0] == cVar1) && (pMVar7->ref_frame[1] == -1)) {
        bVar11 = block_size_high[BVar4];
        iVar17 = (~(uint)block_size_wide[BVar4] & 0x3ffffffe) * 4;
        *local_50 = iVar17;
        local_50[1] = (bVar11 & 0xfe) * 4 + iVar14 * -0x20 + -8;
        *pts_inref = pMVar7->mv[0].as_mv.col + iVar17;
        pts_inref[1] = (int)pMVar7->mv[0].as_mv.row + local_50[1];
        bVar15 = bVar15 + 1;
        if (7 < bVar15) {
          return '\b';
        }
        local_50 = local_50 + 2;
        pts_inref = pts_inref + 2;
      }
    }
    if (((bVar8 && _Var2 == true) && (pMVar7 = ppMVar6[(int)~uVar5], pMVar7->ref_frame[0] == cVar1))
       && (pMVar7->ref_frame[1] == -1)) {
      bVar11 = block_size_high[pMVar7->bsize];
      iVar14 = (~(uint)block_size_wide[pMVar7->bsize] & 0x3ffffffe) * 4;
      *local_50 = iVar14;
      local_50[1] = (~(uint)bVar11 & 0x3ffffffe) << 2;
      *pts_inref = pMVar7->mv[0].as_mv.col + iVar14;
      pts_inref[1] = (int)pMVar7->mv[0].as_mv.row + local_50[1];
      bVar15 = bVar15 + 1;
      if (7 < bVar15) {
        return '\b';
      }
      local_50 = local_50 + 2;
      pts_inref = pts_inref + 2;
    }
  }
  bVar11 = bVar15;
  if (bVar9) {
    bVar18 = xd->width;
    bVar10 = xd->height;
    if (xd->height < bVar18) {
      bVar10 = bVar18;
    }
    iVar14 = has_top_right((AV1_COMMON *)(ulong)*(uint *)&cm->seq_params->sb_size,xd,mi_row,iVar13,
                           (uint)bVar10);
    if (((((iVar14 != 0) && ((xd->tile).mi_row_start < mi_row)) &&
         ((iVar13 = iVar13 + (uint)bVar18, (xd->tile).mi_col_start <= iVar13 &&
          ((mi_row <= (xd->tile).mi_row_end && (iVar13 < (xd->tile).mi_col_end)))))) &&
        (pMVar7 = ppMVar6[(int)(bVar18 - uVar5)], pMVar7->ref_frame[0] == cVar1)) &&
       (pMVar7->ref_frame[1] == -1)) {
      bVar11 = block_size_wide[pMVar7->bsize];
      bVar10 = block_size_high[pMVar7->bsize];
      *local_50 = (uint)bVar18 * 0x20 + -8 + (bVar11 & 0xfe) * 4;
      local_50[1] = (~(uint)bVar10 & 0x3ffffffe) << 2;
      *pts_inref = (int)pMVar7->mv[0].as_mv.col + (uint)bVar18 * 0x20 + (bVar11 & 0xfe) * 4 + -8;
      pts_inref[1] = (int)pMVar7->mv[0].as_mv.row + local_50[1];
      bVar11 = 8;
      if ((byte)(bVar15 + 1) < 8) {
        bVar11 = bVar15 + 1;
      }
    }
  }
  return bVar11;
}

Assistant:

uint8_t av1_findSamples(const AV1_COMMON *cm, MACROBLOCKD *xd, int *pts,
                        int *pts_inref) {
  const MB_MODE_INFO *const mbmi0 = xd->mi[0];
  const int ref_frame = mbmi0->ref_frame[0];
  const int up_available = xd->up_available;
  const int left_available = xd->left_available;
  uint8_t np = 0;
  int do_tl = 1;
  int do_tr = 1;
  const int mi_stride = xd->mi_stride;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // scan the nearest above rows
  if (up_available) {
    const int mi_row_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_row_offset * mi_stride];
    uint8_t superblock_width = mi_size_wide[mbmi->bsize];

    if (xd->width <= superblock_width) {
      // Handle "current block width <= above block width" case.
      const int col_offset = -mi_col % superblock_width;

      if (col_offset < 0) do_tl = 0;
      if (col_offset + superblock_width > xd->width) do_tr = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, col_offset, 1);
        pts += 2;
        pts_inref += 2;
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block width > above block width" case.
      for (int i = 0; i < AOMMIN(xd->width, cm->mi_params.mi_cols - mi_col);
           i += superblock_width) {
        mbmi = xd->mi[i + mi_row_offset * mi_stride];
        superblock_width = mi_size_wide[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, 0, -1, i, 1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // scan the nearest left columns
  if (left_available) {
    const int mi_col_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_col_offset];
    uint8_t superblock_height = mi_size_high[mbmi->bsize];

    if (xd->height <= superblock_height) {
      // Handle "current block height <= above block height" case.
      const int row_offset = -mi_row % superblock_height;

      if (row_offset < 0) do_tl = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, row_offset, 1, 0, -1);
        pts += 2;
        pts_inref += 2;
        np++;
        if (np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block height > above block height" case.
      for (int i = 0; i < AOMMIN(xd->height, cm->mi_params.mi_rows - mi_row);
           i += superblock_height) {
        mbmi = xd->mi[mi_col_offset + i * mi_stride];
        superblock_height = mi_size_high[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, i, 1, 0, -1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-left block
  if (do_tl && left_available && up_available) {
    const int mi_row_offset = -1;
    const int mi_col_offset = -1;
    MB_MODE_INFO *mbmi = xd->mi[mi_col_offset + mi_row_offset * mi_stride];

    if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
      record_samples(mbmi, pts, pts_inref, 0, -1, 0, -1);
      pts += 2;
      pts_inref += 2;
      if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-right block
  if (do_tr &&
      has_top_right(cm, xd, mi_row, mi_col, AOMMAX(xd->width, xd->height))) {
    const POSITION trb_pos = { -1, xd->width };
    const TileInfo *const tile = &xd->tile;
    if (is_inside(tile, mi_col, mi_row, &trb_pos)) {
      const int mi_row_offset = -1;
      const int mi_col_offset = xd->width;
      const MB_MODE_INFO *mbmi =
          xd->mi[mi_col_offset + mi_row_offset * mi_stride];

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, xd->width, 1);
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  return np;
}